

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::_::
CopyConstructArray_<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  Entry *pEVar1;
  ReadableDirectory *pRVar2;
  Disposer *pDVar3;
  String *pSVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  Entry *pEVar7;
  
  pEVar7 = this->pos;
  if (this->start < pEVar7) {
    do {
      pEVar1 = pEVar7 + -1;
      this->pos = pEVar1;
      pRVar2 = pEVar7[-1].value.dir.ptr;
      if (pRVar2 != (ReadableDirectory *)0x0) {
        pEVar7[-1].value.dir.ptr = (ReadableDirectory *)0x0;
        pDVar3 = pEVar7[-1].value.dir.disposer;
        (**pDVar3->_vptr_Disposer)
                  (pDVar3,(pRVar2->super_FsNode)._vptr_FsNode[-2] +
                          (long)&(pRVar2->super_FsNode)._vptr_FsNode);
      }
      pSVar4 = (pEVar1->key).parts.ptr;
      if (pSVar4 != (String *)0x0) {
        sVar5 = pEVar7[-1].key.parts.size_;
        (pEVar1->key).parts.ptr = (String *)0x0;
        pEVar7[-1].key.parts.size_ = 0;
        pAVar6 = pEVar7[-1].key.parts.disposer;
        (**pAVar6->_vptr_ArrayDisposer)
                  (pAVar6,pSVar4,0x18,sVar5,sVar5,ArrayDisposer::Dispose_<kj::String>::destruct);
      }
      pEVar7 = this->pos;
    } while (this->start < pEVar7);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }